

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputSource.cc
# Opt level: O0

bool __thiscall
InputSource::findFirst
          (InputSource *this,char *start_chars,qpdf_offset_t offset,size_t len,Finder *finder)

{
  char cVar1;
  ulong uVar2;
  qpdf_offset_t qVar3;
  qpdf_offset_t __s1;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  logic_error *this_00;
  undefined4 extraout_var;
  size_t sVar7;
  long local_490;
  size_t local_488;
  size_t p_relative_offset;
  ulong local_478;
  size_t bytes_read;
  qpdf_offset_t buf_offset;
  char *p;
  ulong local_450;
  size_t size;
  char buf [1025];
  Finder *finder_local;
  size_t len_local;
  qpdf_offset_t offset_local;
  char *start_chars_local;
  InputSource *this_local;
  
  local_450 = 0x400;
  sVar6 = strlen(start_chars);
  if ((sVar6 == 0) || (sVar6 = strlen(start_chars), local_450 < sVar6)) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,
               "InputSource::findSource called with too small or too large of a character sequence")
    ;
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  buf_offset = 0;
  local_478 = 0;
  bytes_read = offset;
  do {
    qVar3 = buf_offset;
    if ((buf_offset == 0) ||
       (sVar6 = strlen(start_chars), buf + (local_478 - 8) < (char *)(qVar3 + sVar6))) {
      if (buf_offset != 0) {
        QTC::TC("libtests","InputSource read next block",
                (uint)((char *)buf_offset != buf + (local_478 - 8)));
        bytes_read = (buf_offset - (long)&size) + bytes_read;
      }
      (*this->_vptr_InputSource[5])(this,bytes_read,0);
      iVar4 = (*this->_vptr_InputSource[7])(this,&size,local_450);
      local_478 = CONCAT44(extraout_var,iVar4);
      sVar6 = strlen(start_chars);
      if (CONCAT44(extraout_var,iVar4) < sVar6) {
        QTC::TC("libtests","InputSource find EOF",(uint)(local_478 != 0));
        return false;
      }
      memset(buf + (local_478 - 8),0,(local_450 - local_478) + 1);
      buf_offset = (qpdf_offset_t)&size;
    }
    qVar3 = buf_offset;
    uVar2 = local_478;
    cVar1 = *start_chars;
    p_relative_offset = buf_offset - (long)&size;
    sVar7 = QIntC::to_size<long>((long *)&p_relative_offset);
    buf_offset = (qpdf_offset_t)memchr((void *)qVar3,(int)cVar1,uVar2 - sVar7);
    if ((size_t *)buf_offset == (size_t *)0x0) {
      buf_offset = (qpdf_offset_t)(buf + (local_478 - 8));
    }
    else {
      if ((size_t *)buf_offset == &size) {
        QTC::TC("libtests","InputSource found match at buf[0]",0);
      }
      if (len != 0) {
        local_490 = (buf_offset - (long)&size) + (bytes_read - offset);
        local_488 = QIntC::to_size<long_long>(&local_490);
        if (len <= local_488) {
          QTC::TC("libtests","InputSource out of range",0);
          return false;
        }
      }
      qVar3 = buf_offset;
      sVar6 = strlen(start_chars);
      __s1 = buf_offset;
      if (buf + (local_478 - 8) < (char *)(qVar3 + sVar6)) {
        QTC::TC("libtests","InputSource not enough bytes",0);
      }
      else {
        sVar6 = strlen(start_chars);
        iVar4 = strncmp((char *)__s1,start_chars,sVar6);
        if (iVar4 == 0) {
          (*this->_vptr_InputSource[5])(this,bytes_read + (buf_offset - (long)&size),0);
          uVar5 = (*finder->_vptr_Finder[2])();
          if ((uVar5 & 1) != 0) {
            return true;
          }
          QTC::TC("libtests","InputSource start_chars matched but not check",0);
        }
        else {
          QTC::TC("libtests","InputSource first char matched but not string",0);
        }
        buf_offset = buf_offset + 1;
      }
    }
  } while( true );
}

Assistant:

bool
InputSource::findFirst(char const* start_chars, qpdf_offset_t offset, size_t len, Finder& finder)
{
    // Basic approach: search for the first character of start_chars starting from offset but not
    // going past len (if len != 0). Once the first character is found, see if it is the beginning
    // of a sequence of characters matching start_chars. If so, call finder.check() to do
    // caller-specific additional checks. If not, keep searching.

    // This code is tricky and highly subject to off-by-one or other edge case logic errors. See
    // comments throughout that explain how we're not missing any edge cases. There are also tests
    // specifically constructed to make sure we caught the edge cases in testing.

    char buf[1025]; // size known to input_source.cc in libtests
    // To enable us to guarantee null-termination, save an extra byte so that buf[size] is valid
    // memory.
    size_t size = sizeof(buf) - 1;
    if ((strlen(start_chars) < 1) || (strlen(start_chars) > size)) {
        throw std::logic_error(
            "InputSource::findSource called with too small or too large of a character sequence");
    }

    char* p = nullptr;
    qpdf_offset_t buf_offset = offset;
    size_t bytes_read = 0;

    // Guarantee that we return from this loop. Each time through, we either return, advance p, or
    // restart the loop with a condition that will cause return on the next pass. Eventually we will
    // either be out of range or hit EOF, either of which forces us to return.
    while (true) {
        // Do we need to read more data? Pretend size = 5, buf starts at 0, and start_chars has 3
        // characters. buf[5] is valid and null. If p == 2, start_chars could be buf[2] through
        // buf[4], so p + strlen(start_chars) == buf + size is okay. If p points to buf[size], since
        // strlen(start_chars) is always >= 1, this overflow test will be correct for that case
        // regardless of start_chars.
        if ((p == nullptr) || ((p + strlen(start_chars)) > (buf + bytes_read))) {
            if (p) {
                QTC::TC(
                    "libtests", "InputSource read next block", ((p == buf + bytes_read) ? 0 : 1));
                buf_offset += (p - buf);
            }
            this->seek(buf_offset, SEEK_SET);
            // Read into buffer and zero out the rest of the buffer including buf[size]. We
            // allocated an extra byte so that we could guarantee null termination as an extra
            // protection against overrun when using string functions.
            bytes_read = this->read(buf, size);
            if (bytes_read < strlen(start_chars)) {
                QTC::TC("libtests", "InputSource find EOF", bytes_read == 0 ? 0 : 1);
                return false;
            }
            memset(buf + bytes_read, '\0', 1 + (size - bytes_read));
            p = buf;
        }

        // Search for the first character.
        if ((p = static_cast<char*>(
                 // line-break
                 memchr(p, start_chars[0], bytes_read - QIntC::to_size(p - buf)))) != nullptr) {
            if (p == buf) {
                QTC::TC("libtests", "InputSource found match at buf[0]");
            }
            // Found first letter.
            if (len != 0) {
                // Make sure it's in range.
                size_t p_relative_offset = QIntC::to_size((p - buf) + (buf_offset - offset));
                if (p_relative_offset >= len) {
                    // out of range
                    QTC::TC("libtests", "InputSource out of range");
                    return false;
                }
            }
            if ((p + strlen(start_chars)) > (buf + bytes_read)) {
                // If there are not enough bytes left in the file for start_chars, we will detect
                // this on the next pass as EOF and return.
                QTC::TC("libtests", "InputSource not enough bytes");
                continue;
            }

            // See if p points to a sequence matching start_chars. We already checked above to make
            // sure we are not going to overrun memory.
            if (strncmp(p, start_chars, strlen(start_chars)) == 0) {
                // Call finder.check() with the input source positioned to the point of the match.
                this->seek(buf_offset + (p - buf), SEEK_SET);
                if (finder.check()) {
                    return true;
                } else {
                    QTC::TC("libtests", "InputSource start_chars matched but not check");
                }
            } else {
                QTC::TC("libtests", "InputSource first char matched but not string");
            }
            // This occurrence of the first character wasn't a match. Skip over it and keep
            // searching.
            ++p;
        } else {
            // Trigger reading the next block
            p = buf + bytes_read;
        }
    }
    throw std::logic_error("InputSource after while (true)");
}